

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O2

ulint __thiscall
bwtil::WaveletTree::recursiveRank(WaveletTree *this,uchar c,ulint i,ulint node,uint level)

{
  pointer psVar1;
  long lVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  succinct_bitvector *this_00;
  uint uVar5;
  uint uVar6;
  ulint uVar4;
  
  uVar5 = ~level;
  while( true ) {
    psVar1 = (this->nodes).
             super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar1[node].n == 0) {
      return 0;
    }
    this_00 = psVar1 + node;
    uVar6 = 1 << (this->log_sigma + uVar5 & 0x1f) & (uint)CONCAT71(in_register_00000031,c);
    if (uVar6 == 0) {
      uVar4 = succinct_bitvector::rank0(this_00,i);
      uVar3 = (uint)uVar4;
    }
    else {
      uVar4 = succinct_bitvector::rank1(this_00,i);
      uVar3 = (uint)uVar4;
    }
    i = (ulint)uVar3;
    if (level == this->log_sigma - 1) break;
    lVar2 = node * 2;
    node = node * 2 + 2;
    if (uVar6 == 0) {
      node = lVar2 + 1;
    }
    level = level + 1;
    uVar5 = uVar5 - 1;
  }
  return i;
}

Assistant:

ulint recursiveRank(uchar c, ulint i, ulint node, uint level){//number of characters 'c' before position i excluded

		if(nodes[node].length()==0)//empty node
			return 0;

		uint bit = bitInChar(c,level);
		uint rank;

		if(bit==0)
			rank = nodes[node].rank0(i);
		else
			rank = nodes[node].rank1(i);

		if(level==log_sigma-1)//leaf
			return rank;

		//not a leaf: proceed recursively

		return recursiveRank(c, rank, (bit==0?child0(node):child1(node)), level+1);

	}